

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Account.h
# Opt level: O2

void __thiscall L13_3::BankAccount::~BankAccount(BankAccount *this)

{
  Account::~Account(&this->super_Account);
  operator_delete(this);
  return;
}

Assistant:

virtual ~BankAccount(){}